

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O1

Result __thiscall cmGeneratorExpressionDAGChecker::CheckGraph(cmGeneratorExpressionDAGChecker *this)

{
  cmGeneratorTarget *pcVar1;
  pointer __s1;
  size_t __n;
  int iVar2;
  cmGeneratorExpressionDAGChecker *pcVar3;
  
  pcVar3 = this->Parent;
  if (pcVar3 != (cmGeneratorExpressionDAGChecker *)0x0) {
    pcVar1 = this->Target;
    __s1 = (this->Property)._M_dataplus._M_p;
    __n = (this->Property)._M_string_length;
    do {
      if (((pcVar1 == pcVar3->Target) && (__n == (pcVar3->Property)._M_string_length)) &&
         ((__n == 0 || (iVar2 = bcmp(__s1,(pcVar3->Property)._M_dataplus._M_p,__n), iVar2 == 0)))) {
        return (pcVar3 != this->Parent) + SELF_REFERENCE;
      }
      pcVar3 = pcVar3->Parent;
    } while (pcVar3 != (cmGeneratorExpressionDAGChecker *)0x0);
  }
  return DAG;
}

Assistant:

cmGeneratorExpressionDAGChecker::Result
cmGeneratorExpressionDAGChecker::CheckGraph() const
{
  const cmGeneratorExpressionDAGChecker* parent = this->Parent;
  while (parent) {
    if (this->Target == parent->Target && this->Property == parent->Property) {
      return (parent == this->Parent) ? SELF_REFERENCE : CYCLIC_REFERENCE;
    }
    parent = parent->Parent;
  }
  return DAG;
}